

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# age.cpp
# Opt level: O1

void duckdb::AgeFunction(DataChunk *input,ExpressionState *state,Vector *result)

{
  ValidityMask *pVVar1;
  undefined1 *puVar2;
  VectorType VVar3;
  VectorType VVar4;
  unsigned_long *puVar5;
  interval_t *piVar6;
  timestamp_t timestamp_1;
  timestamp_t timestamp_2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  ulong *puVar8;
  SelectionVector *pSVar9;
  data_ptr_t pdVar10;
  data_ptr_t pdVar11;
  data_ptr_t pdVar12;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Var13;
  sel_t *psVar14;
  undefined8 uVar15;
  byte bVar16;
  data_ptr_t pdVar17;
  element_type *peVar18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var19;
  reference vector;
  reference vector_00;
  TemplatedValidityData<unsigned_long> *pTVar20;
  SelectionVector *pSVar21;
  _Head_base<0UL,_unsigned_long_*,_false> _Var22;
  SelectionVector *pSVar23;
  ulong uVar24;
  int64_t *piVar25;
  timestamp_t lentry;
  unsigned_long uVar26;
  SelectionVector *pSVar27;
  ValidityMask *other;
  idx_t idx_in_entry;
  ulong uVar28;
  timestamp_t lentry_1;
  interval_t iVar29;
  UnifiedVectorFormat ldata;
  int64_t *local_128;
  UnifiedVectorFormat local_e8;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  UnifiedVectorFormat local_80;
  idx_t local_38;
  
  vector = vector<duckdb::Vector,_true>::operator[](&input->data,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[](&input->data,1);
  VVar3 = vector->vector_type;
  VVar4 = vector_00->vector_type;
  if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar5 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    piVar6 = (interval_t *)result->data;
    if (((puVar5 == (unsigned_long *)0x0) || ((*puVar5 & 1) != 0)) &&
       ((puVar5 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar5 == (unsigned_long *)0x0 || ((*puVar5 & 1) != 0)))) {
      timestamp_1.value = *(int64_t *)vector->data;
      if ((((timestamp_1.value == -0x7fffffffffffffff) || (timestamp_1.value == 0x7fffffffffffffff))
          || (timestamp_2.value = *(int64_t *)vector_00->data,
             timestamp_2.value == -0x7fffffffffffffff)) || (timestamp_2.value == 0x7fffffffffffffff)
         ) {
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          local_80.sel = (SelectionVector *)
                         (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_e8,(unsigned_long *)&local_80);
          pdVar10 = local_e8.data;
          pSVar9 = local_e8.sel;
          local_e8.sel = (SelectionVector *)0x0;
          local_e8.data = (data_ptr_t)0x0;
          p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)pSVar9;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar10;
          if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.data !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.data);
          }
          pTVar20 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)
               (pTVar20->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        puVar8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        *puVar8 = *puVar8 & 0xfffffffffffffffe;
        iVar29 = (interval_t)ZEXT816(0);
      }
      else {
        iVar29 = Interval::GetAge(timestamp_1,timestamp_2);
      }
      *piVar6 = iVar29;
      return;
    }
  }
  else {
    pSVar9 = (SelectionVector *)input->count;
    if ((VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar3 == FLAT_VECTOR) {
      pdVar10 = vector->data;
      pdVar11 = vector_00->data;
      puVar5 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 == (unsigned_long *)0x0) || ((*puVar5 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar12 = result->data;
        FlatVector::VerifyFlatVector(result);
        pVVar1 = &result->validity;
        FlatVector::VerifyFlatVector(vector);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)pSVar9;
        if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_80.sel = pSVar9;
          if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
          }
          _Var22._M_head_impl = (unsigned_long *)0x0;
        }
        else {
          local_80.sel = pSVar9;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)&local_e8,(unsigned_long **)&vector->validity,
                     (unsigned_long *)&local_80);
          pdVar17 = local_e8.data;
          pSVar27 = local_e8.sel;
          local_e8.sel = (SelectionVector *)0x0;
          local_e8.data = (data_ptr_t)0x0;
          p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)pSVar27;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar17;
          if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.data !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.data);
          }
          pTVar20 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var22._M_head_impl =
               (pTVar20->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        }
        (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var22._M_head_impl;
        if (_Var22._M_head_impl != (unsigned_long *)0x0) {
          puVar2 = (undefined1 *)
                   ((long)&pSVar9[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr + 7);
          if (puVar2 < (undefined1 *)0x40) {
            return;
          }
          uVar24 = 0;
          pSVar27 = (SelectionVector *)0x0;
          do {
            puVar5 = (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              uVar26 = 0xffffffffffffffff;
            }
            else {
              uVar26 = puVar5[uVar24];
            }
            pSVar21 = (SelectionVector *)
                      &pSVar27[2].selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount;
            if (pSVar9 <= pSVar21) {
              pSVar21 = pSVar9;
            }
            pSVar23 = pSVar21;
            if (uVar26 != 0) {
              pSVar23 = pSVar27;
              if (uVar26 == 0xffffffffffffffff) {
                if (pSVar27 < pSVar21) {
                  uVar15 = *(undefined8 *)pdVar11;
                  piVar25 = (int64_t *)(pdVar12 + (long)pSVar27 * 0x10 + 8);
                  do {
                    iVar29 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                                       (*(undefined8 *)(pdVar10 + (long)pSVar23 * 8),uVar15,pVVar1,
                                        pSVar23);
                    piVar25[-1] = iVar29._0_8_;
                    *piVar25 = iVar29.micros;
                    pSVar23 = (SelectionVector *)((long)&pSVar23->sel_vector + 1);
                    piVar25 = piVar25 + 2;
                  } while (pSVar21 != pSVar23);
                }
              }
              else if (pSVar27 < pSVar21) {
                piVar25 = (int64_t *)(pdVar12 + (long)pSVar27 * 0x10 + 8);
                uVar28 = 0;
                do {
                  if ((uVar26 >> (uVar28 & 0x3f) & 1) != 0) {
                    iVar29 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                                       (*(undefined8 *)(pdVar10 + uVar28 * 8 + (long)pSVar27 * 8),
                                        *(undefined8 *)pdVar11,pVVar1,
                                        (long)&pSVar27->sel_vector + uVar28);
                    piVar25[-1] = iVar29._0_8_;
                    *piVar25 = iVar29.micros;
                  }
                  uVar28 = uVar28 + 1;
                  piVar25 = piVar25 + 2;
                } while ((long)pSVar27 + (uVar28 - (long)pSVar21) != 0);
                pSVar23 = (SelectionVector *)((long)&pSVar27->sel_vector + uVar28);
              }
            }
            uVar24 = uVar24 + 1;
            pSVar27 = pSVar23;
          } while (uVar24 != (ulong)puVar2 >> 6);
          return;
        }
        if (pSVar9 == (SelectionVector *)0x0) {
          return;
        }
        uVar15 = *(undefined8 *)pdVar11;
        local_128 = (int64_t *)(pdVar12 + 8);
        pSVar27 = (SelectionVector *)0x0;
        do {
          iVar29 = BinaryLambdaWrapperWithNulls::
                   Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                             (*(undefined8 *)(pdVar10 + (long)pSVar27 * 8),uVar15,pVVar1,pSVar27);
          local_128[-1] = iVar29._0_8_;
          *local_128 = iVar29.micros;
          pSVar27 = (SelectionVector *)((long)&pSVar27->sel_vector + 1);
          local_128 = local_128 + 2;
        } while (pSVar9 != pSVar27);
        return;
      }
    }
    else {
      if ((VVar3 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar4 != FLAT_VECTOR) {
        if (VVar4 == FLAT_VECTOR && VVar3 == FLAT_VECTOR) {
          pdVar10 = vector->data;
          pdVar11 = vector_00->data;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar12 = result->data;
          FlatVector::VerifyFlatVector(result);
          pVVar1 = &result->validity;
          FlatVector::VerifyFlatVector(vector);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)pSVar9;
          if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)0x0;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_80.sel = pSVar9;
            if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
            }
            _Var22._M_head_impl = (unsigned_long *)0x0;
          }
          else {
            local_80.sel = pSVar9;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                      ((duckdb *)&local_e8,(unsigned_long **)&vector->validity,
                       (unsigned_long *)&local_80);
            pdVar17 = local_e8.data;
            pSVar27 = local_e8.sel;
            local_e8.sel = (SelectionVector *)0x0;
            local_e8.data = (data_ptr_t)0x0;
            p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)pSVar27;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar17;
            if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.data !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.data);
            }
            pTVar20 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                  validity_data);
            _Var22._M_head_impl =
                 (pTVar20->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          }
          (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var22._M_head_impl;
          FlatVector::VerifyFlatVector(vector_00);
          other = &vector_00->validity;
          if (_Var22._M_head_impl == (unsigned_long *)0x0) {
            (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)pSVar9;
            if ((other->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
                (unsigned_long *)0x0) {
              p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)0x0;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_80.sel = pSVar9;
              if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
              }
              _Var22._M_head_impl = (unsigned_long *)0x0;
            }
            else {
              local_80.sel = pSVar9;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                        ((duckdb *)&local_e8,(unsigned_long **)other,(unsigned_long *)&local_80);
              pdVar17 = local_e8.data;
              pSVar27 = local_e8.sel;
              local_e8.sel = (SelectionVector *)0x0;
              local_e8.data = (data_ptr_t)0x0;
              p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)pSVar27;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar17;
              if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.data !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.data);
              }
              pTVar20 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                    validity_data);
              _Var22._M_head_impl =
                   (pTVar20->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            }
            (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var22._M_head_impl
            ;
          }
          else {
            ValidityMask::Combine(pVVar1,other,(idx_t)pSVar9);
          }
          if ((pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
              (unsigned_long *)0x0) {
            if (pSVar9 != (SelectionVector *)0x0) {
              local_128 = (int64_t *)(pdVar12 + 8);
              pSVar27 = (SelectionVector *)0x0;
              do {
                iVar29 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                                   (*(undefined8 *)(pdVar10 + (long)pSVar27 * 8),
                                    *(undefined8 *)(pdVar11 + (long)pSVar27 * 8),pVVar1,pSVar27);
                local_128[-1] = iVar29._0_8_;
                *local_128 = iVar29.micros;
                pSVar27 = (SelectionVector *)((long)&pSVar27->sel_vector + 1);
                local_128 = local_128 + 2;
              } while (pSVar9 != pSVar27);
            }
          }
          else {
            puVar2 = (undefined1 *)
                     ((long)&pSVar9[2].selection_data.internal.
                             super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr + 7);
            if ((undefined1 *)0x3f < puVar2) {
              uVar24 = 0;
              pSVar27 = (SelectionVector *)0x0;
              do {
                puVar5 = (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  uVar26 = 0xffffffffffffffff;
                }
                else {
                  uVar26 = puVar5[uVar24];
                }
                pSVar21 = (SelectionVector *)
                          &pSVar27[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount;
                if (pSVar9 <= pSVar21) {
                  pSVar21 = pSVar9;
                }
                pSVar23 = pSVar21;
                if (uVar26 != 0) {
                  pSVar23 = pSVar27;
                  if (uVar26 == 0xffffffffffffffff) {
                    if (pSVar27 < pSVar21) {
                      piVar25 = (int64_t *)(pdVar12 + (long)pSVar27 * 0x10 + 8);
                      do {
                        iVar29 = BinaryLambdaWrapperWithNulls::
                                 Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                                           (*(undefined8 *)(pdVar10 + (long)pSVar27 * 8),
                                            *(undefined8 *)(pdVar11 + (long)pSVar27 * 8),pVVar1,
                                            pSVar27);
                        piVar25[-1] = iVar29._0_8_;
                        *piVar25 = iVar29.micros;
                        pSVar27 = (SelectionVector *)((long)&pSVar27->sel_vector + 1);
                        piVar25 = piVar25 + 2;
                        pSVar23 = pSVar27;
                      } while (pSVar21 != pSVar27);
                    }
                  }
                  else if (pSVar27 < pSVar21) {
                    piVar25 = (int64_t *)(pdVar12 + (long)pSVar27 * 0x10 + 8);
                    uVar28 = 0;
                    do {
                      if ((uVar26 >> (uVar28 & 0x3f) & 1) != 0) {
                        iVar29 = BinaryLambdaWrapperWithNulls::
                                 Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                                           (*(undefined8 *)
                                             (pdVar10 + uVar28 * 8 + (long)pSVar27 * 8),
                                            *(undefined8 *)
                                             (pdVar11 + uVar28 * 8 + (long)pSVar27 * 8),pVVar1,
                                            (long)&pSVar27->sel_vector + uVar28);
                        piVar25[-1] = iVar29._0_8_;
                        *piVar25 = iVar29.micros;
                      }
                      uVar28 = uVar28 + 1;
                      piVar25 = piVar25 + 2;
                    } while ((long)pSVar27 + (uVar28 - (long)pSVar21) != 0);
                    pSVar23 = (SelectionVector *)((long)&pSVar27->sel_vector + uVar28);
                  }
                }
                uVar24 = uVar24 + 1;
                pSVar27 = pSVar23;
              } while (uVar24 != (ulong)puVar2 >> 6);
            }
          }
        }
        else {
          UnifiedVectorFormat::UnifiedVectorFormat(&local_e8);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_80);
          Vector::ToUnifiedFormat(vector,(idx_t)pSVar9,&local_e8);
          Vector::ToUnifiedFormat(vector_00,(idx_t)pSVar9,&local_80);
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar10 = result->data;
          FlatVector::VerifyFlatVector(result);
          pVVar1 = &result->validity;
          if (local_80.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0 &&
              local_e8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (pSVar9 != (SelectionVector *)0x0) {
              _Var13._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                   (((unsafe_unique_array<unsigned_long> *)&(local_e8.sel)->sel_vector)->
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
              psVar14 = (local_80.sel)->sel_vector;
              piVar25 = (int64_t *)(pdVar10 + 8);
              pSVar27 = (SelectionVector *)0x0;
              do {
                pSVar21 = pSVar27;
                if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                    _Var13._M_t.
                    super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                    super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
                    (unsigned_long *)0x0) {
                  pSVar21 = (SelectionVector *)
                            (ulong)*(uint *)((long)_Var13._M_t.
                                                                                                      
                                                  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                                  .super__Head_base<0UL,_unsigned_long_*,_false>.
                                                  _M_head_impl + (long)pSVar27 * 4);
                }
                pSVar23 = pSVar27;
                if (psVar14 != (sel_t *)0x0) {
                  pSVar23 = (SelectionVector *)(ulong)psVar14[(long)pSVar27];
                }
                iVar29 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                                   (((_func_int ***)local_e8.data)[(long)pSVar21],
                                    *(undefined8 *)(local_80.data + (long)pSVar23 * 8),pVVar1,
                                    pSVar27);
                piVar25[-1] = iVar29._0_8_;
                *piVar25 = iVar29.micros;
                pSVar27 = (SelectionVector *)((long)&pSVar27->sel_vector + 1);
                piVar25 = piVar25 + 2;
              } while (pSVar9 != pSVar27);
            }
          }
          else if (pSVar9 != (SelectionVector *)0x0) {
            _Var13._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                 (((unsafe_unique_array<unsigned_long> *)&(local_e8.sel)->sel_vector)->
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
            psVar14 = (local_80.sel)->sel_vector;
            piVar25 = (int64_t *)(pdVar10 + 8);
            pSVar27 = (SelectionVector *)0x0;
            do {
              pSVar21 = pSVar27;
              if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                  _Var13._M_t.
                  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0
                 ) {
                pSVar21 = (SelectionVector *)
                          (ulong)*(uint *)((long)_Var13._M_t.
                                                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                                 .super__Head_base<0UL,_unsigned_long_*,_false>.
                                                 _M_head_impl + (long)pSVar27 * 4);
              }
              pSVar23 = pSVar27;
              if (psVar14 != (sel_t *)0x0) {
                pSVar23 = (SelectionVector *)(ulong)psVar14[(long)pSVar27];
              }
              if (((local_e8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                    (unsigned_long *)0x0) ||
                  ((local_e8.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [(ulong)pSVar21 >> 6] >> ((ulong)pSVar21 & 0x3f) & 1) != 0)) &&
                 ((local_80.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                   (unsigned_long *)0x0 ||
                  ((local_80.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [(ulong)pSVar23 >> 6] >> ((ulong)pSVar23 & 0x3f) & 1) != 0)))) {
                iVar29 = BinaryLambdaWrapperWithNulls::
                         Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                                   (((_func_int ***)local_e8.data)[(long)pSVar21],
                                    *(undefined8 *)(local_80.data + (long)pSVar23 * 8),pVVar1,
                                    pSVar27);
                piVar25[-1] = iVar29._0_8_;
                *piVar25 = iVar29.micros;
              }
              else {
                if ((pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
                    (unsigned_long *)0x0) {
                  local_38 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                            ((duckdb *)&local_98,&local_38);
                  p_Var19 = p_Stack_90;
                  peVar18 = local_98;
                  local_98 = (element_type *)0x0;
                  p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.
                           validity_data.internal.
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = peVar18;
                  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                  internal.
                  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = p_Var19;
                  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
                  }
                  if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
                  }
                  pTVar20 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                            operator->(&(result->validity).
                                        super_TemplatedValidityMask<unsigned_long>.validity_data);
                  (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask =
                       (unsigned_long *)
                       (pTVar20->owned_data).
                       super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t
                       .super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                       .super__Head_base<0UL,_unsigned_long_*,_false>;
                }
                bVar16 = (byte)pSVar27 & 0x3f;
                puVar8 = (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask +
                         ((ulong)pSVar27 >> 6);
                *puVar8 = *puVar8 & (-2L << bVar16 | 0xfffffffffffffffeU >> 0x40 - bVar16);
              }
              pSVar27 = (SelectionVector *)((long)&pSVar27->sel_vector + 1);
              piVar25 = piVar25 + 2;
            } while (pSVar9 != pSVar27);
          }
          if (local_80.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_80.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_80.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_80.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if (local_e8.owned_sel.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_e8.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_e8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_e8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
        }
        return;
      }
      pdVar10 = vector->data;
      puVar5 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar11 = vector_00->data;
      if ((puVar5 == (unsigned_long *)0x0) || ((*puVar5 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar12 = result->data;
        FlatVector::VerifyFlatVector(result);
        pVVar1 = &result->validity;
        FlatVector::VerifyFlatVector(vector_00);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = (idx_t)pSVar9;
        if ((vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_80.sel = pSVar9;
          if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
          }
          _Var22._M_head_impl = (unsigned_long *)0x0;
        }
        else {
          local_80.sel = pSVar9;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                    ((duckdb *)&local_e8,(unsigned_long **)&vector_00->validity,
                     (unsigned_long *)&local_80);
          pdVar17 = local_e8.data;
          pSVar27 = local_e8.sel;
          local_e8.sel = (SelectionVector *)0x0;
          local_e8.data = (data_ptr_t)0x0;
          p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)pSVar27;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar17;
          if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.data !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.data);
          }
          pTVar20 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          _Var22._M_head_impl =
               (pTVar20->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        }
        (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var22._M_head_impl;
        if (_Var22._M_head_impl != (unsigned_long *)0x0) {
          puVar2 = (undefined1 *)
                   ((long)&pSVar9[2].selection_data.internal.
                           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr + 7);
          if (puVar2 < (undefined1 *)0x40) {
            return;
          }
          uVar24 = 0;
          pSVar27 = (SelectionVector *)0x0;
          do {
            puVar5 = (pVVar1->super_TemplatedValidityMask<unsigned_long>).validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              uVar26 = 0xffffffffffffffff;
            }
            else {
              uVar26 = puVar5[uVar24];
            }
            pSVar21 = (SelectionVector *)
                      &pSVar27[2].selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount;
            if (pSVar9 <= pSVar21) {
              pSVar21 = pSVar9;
            }
            pSVar23 = pSVar21;
            if (uVar26 != 0) {
              pSVar23 = pSVar27;
              if (uVar26 == 0xffffffffffffffff) {
                if (pSVar27 < pSVar21) {
                  uVar15 = *(undefined8 *)pdVar10;
                  piVar25 = (int64_t *)(pdVar12 + (long)pSVar27 * 0x10 + 8);
                  do {
                    iVar29 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                                       (uVar15,*(undefined8 *)(pdVar11 + (long)pSVar23 * 8),pVVar1,
                                        pSVar23);
                    piVar25[-1] = iVar29._0_8_;
                    *piVar25 = iVar29.micros;
                    pSVar23 = (SelectionVector *)((long)&pSVar23->sel_vector + 1);
                    piVar25 = piVar25 + 2;
                  } while (pSVar21 != pSVar23);
                }
              }
              else if (pSVar27 < pSVar21) {
                piVar25 = (int64_t *)(pdVar12 + (long)pSVar27 * 0x10 + 8);
                uVar28 = 0;
                do {
                  if ((uVar26 >> (uVar28 & 0x3f) & 1) != 0) {
                    iVar29 = BinaryLambdaWrapperWithNulls::
                             Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                                       (*(undefined8 *)pdVar10,
                                        *(undefined8 *)(pdVar11 + uVar28 * 8 + (long)pSVar27 * 8),
                                        pVVar1,(long)&pSVar27->sel_vector + uVar28);
                    piVar25[-1] = iVar29._0_8_;
                    *piVar25 = iVar29.micros;
                  }
                  uVar28 = uVar28 + 1;
                  piVar25 = piVar25 + 2;
                } while ((long)pSVar27 + (uVar28 - (long)pSVar21) != 0);
                pSVar23 = (SelectionVector *)((long)&pSVar27->sel_vector + uVar28);
              }
            }
            uVar24 = uVar24 + 1;
            pSVar27 = pSVar23;
          } while (uVar24 != (ulong)puVar2 >> 6);
          return;
        }
        if (pSVar9 == (SelectionVector *)0x0) {
          return;
        }
        uVar15 = *(undefined8 *)pdVar10;
        local_128 = (int64_t *)(pdVar12 + 8);
        pSVar27 = (SelectionVector *)0x0;
        do {
          iVar29 = BinaryLambdaWrapperWithNulls::
                   Operation<duckdb::AgeFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::interval_t>
                             (uVar15,*(undefined8 *)(pdVar11 + (long)pSVar27 * 8),pVVar1,pSVar27);
          local_128[-1] = iVar29._0_8_;
          *local_128 = iVar29.micros;
          pSVar27 = (SelectionVector *)((long)&pSVar27->sel_vector + 1);
          local_128 = local_128 + 2;
        } while (pSVar9 != pSVar27);
        return;
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void AgeFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	D_ASSERT(input.ColumnCount() == 2);

	BinaryExecutor::ExecuteWithNulls<timestamp_t, timestamp_t, interval_t>(
	    input.data[0], input.data[1], result, input.size(),
	    [&](timestamp_t input1, timestamp_t input2, ValidityMask &mask, idx_t idx) {
		    if (Timestamp::IsFinite(input1) && Timestamp::IsFinite(input2)) {
			    return Interval::GetAge(input1, input2);
		    } else {
			    mask.SetInvalid(idx);
			    return interval_t();
		    }
	    });
}